

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::DistributeProbability
          (BayesianGameCollaborativeGraphical *this,Index jtI,double p)

{
  BayesianGameIdenticalPayoff *this_00;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices;
  ulong uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivTypes;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_50;
  double local_38;
  
  local_38 = p;
  if ((this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_useSparse == true
     ) {
    local_50.
    super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    .c_ = &(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
           _m_jTypeProbsSparse;
    local_50.i_ = (ulong)jtI;
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::set(&local_50,&local_38);
  }
  else {
    (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_jTypeProbs.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [jtI] = p;
  }
  indivIndices = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this,jtI);
  if (this->_m_nrLRFs != 0) {
    uVar1 = 0;
    do {
      RestrictIndividualIndicesToScope<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,this,indivIndices,
                 (Index)uVar1);
      this_00 = (this->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar1];
      i = IndexTools::IndividualToJointIndicesStepSize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,
                     (this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                     _m_stepSizeTypes);
      BayesianGameBase::AddProbability((BayesianGameBase *)this_00,i,p);
      if (local_50.
          super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
          .c_ != (container_type *)0x0) {
        operator_delete(local_50.
                        super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                        .c_,(long)local_50.d_ -
                            (long)local_50.
                                  super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                                  .c_);
      }
      uVar1 = (ulong)((Index)uVar1 + 1);
    } while (uVar1 < this->_m_nrLRFs);
  }
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::DistributeProbability(Index jtI, double p)
{
    //set the probability of the joint type (represented by the 
    //BayesianGameBase )
    BayesianGameBase::SetProbability(jtI, p);

    //for each LRF add p to the consistent vars.
    const vector<Index> &indTypes = JointToIndividualTypeIndices(jtI);
    
    for(Index e = 0; e < _m_nrLRFs; e++)
    {    
        vector<Index> restrictedIndivTypes = RestrictIndividualIndicesToScope(
            indTypes, e);
        //now we have a smaller vector with the individual types restricted
        //to the agent in the scope of e
        _m_LRFs[e]->AddProbability(restrictedIndivTypes, p);
    }

}